

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instanceid_keys.c
# Opt level: O0

LY_ERR lyplg_type_store_instanceid_keys
                 (ly_ctx *ctx,lysc_type *type,void *value,size_t value_len,uint32_t options,
                 LY_VALUE_FORMAT format,void *prefix_data,uint32_t hints,lysc_node *UNUSED_ctx_node,
                 lyd_value *storage,lys_glob_unres *UNUSED_unres,ly_err_item **err)

{
  lyxp_expr *range;
  size_t value_00;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 uVar1;
  char *local_98;
  char *local_80;
  char *local_68;
  char *canon;
  ly_err_item *eitem;
  uint32_t *puStack_50;
  uint32_t temp_lo;
  uint32_t *prev_lo;
  lyd_value_instance_identifier_keys *val;
  lysc_type_str *type_str;
  LY_VALUE_FORMAT local_30;
  LY_ERR ret;
  LY_VALUE_FORMAT format_local;
  uint32_t options_local;
  size_t value_len_local;
  void *value_local;
  lysc_type *type_local;
  ly_ctx *ctx_local;
  
  uVar1 = (undefined4)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  type_str._4_4_ = 0;
  eitem._4_4_ = 2;
  val = (lyd_value_instance_identifier_keys *)type;
  local_30 = format;
  ret = options;
  _format_local = value_len;
  value_len_local = (size_t)value;
  value_local = type;
  type_local = (lysc_type *)ctx;
  memset(storage,0,0x28);
  prev_lo = (uint32_t *)calloc(1,0x20);
  (storage->field_2).dyn_mem = prev_lo;
  if (prev_lo == (uint32_t *)0x0) {
    type_str._4_4_ = LY_EMEM;
  }
  else {
    storage->realtype = (lysc_type *)value_local;
    type_str._4_4_ =
         lyplg_type_check_hints
                   (hints,(char *)value_len_local,_format_local,
                    *(LY_DATA_TYPE *)((long)value_local + 0x18),(int *)0x0,err);
    if (type_str._4_4_ == LY_SUCCESS) {
      if (val[1].keys != (lyxp_expr *)0x0) {
        range = val[1].keys;
        value_00 = ly_utf8len((char *)value_len_local,_format_local);
        type_str._4_4_ =
             lyplg_type_validate_range
                       (LY_TYPE_STRING,(lysc_range *)range,value_00,(char *)value_len_local,
                        _format_local,err);
        if (type_str._4_4_ != LY_SUCCESS) goto LAB_00234ece;
      }
      type_str._4_4_ = 0;
      type_str._4_4_ =
           lyplg_type_validate_patterns
                     ((lysc_pattern **)val[1].ctx,(char *)value_len_local,_format_local,err);
      if (type_str._4_4_ == LY_SUCCESS) {
        if ((_format_local == 0) || (*(char *)value_len_local == '[')) {
          puStack_50 = ly_temp_log_options((uint32_t *)((long)&eitem + 4));
          if (_format_local == 0) {
            local_80 = "";
          }
          else {
            local_80 = (char *)value_len_local;
          }
          type_str._4_4_ =
               ly_path_parse_predicate
                         ((ly_ctx *)type_local,(lysc_node *)0x0,local_80,_format_local,0x10,0x100,
                          (lyxp_expr **)prev_lo);
          ly_temp_log_options(puStack_50);
          if (type_str._4_4_ == LY_SUCCESS) {
            *(lysc_type **)(prev_lo + 2) = type_local;
            type_str._4_4_ =
                 lyplg_type_prefix_data_new
                           ((ly_ctx *)type_local,(void *)value_len_local,_format_local,local_30,
                            prefix_data,prev_lo + 6,(void **)(prev_lo + 4));
            if (type_str._4_4_ == LY_SUCCESS) {
              if (local_30 != LY_VALUE_CANON) {
                if (local_30 - LY_VALUE_SCHEMA < 3) {
                  type_str._4_4_ =
                       instanceid_keys_print_value
                                 ((lyd_value_instance_identifier_keys *)prev_lo,LY_VALUE_JSON,
                                  (void *)0x0,&local_68,err);
                  if (type_str._4_4_ == LY_SUCCESS) {
                    type_str._4_4_ =
                         lydict_insert_zc((ly_ctx *)type_local,local_68,&storage->_canonical);
                  }
                  goto LAB_00234ece;
                }
                if (2 < local_30 - LY_VALUE_JSON) goto LAB_00234ece;
              }
              if ((ret & LY_EMEM) == LY_SUCCESS) {
                if (_format_local == 0) {
                  local_98 = "";
                }
                else {
                  local_98 = (char *)value_len_local;
                }
                type_str._4_4_ =
                     lydict_insert((ly_ctx *)type_local,local_98,_format_local,&storage->_canonical)
                ;
              }
              else {
                type_str._4_4_ =
                     lydict_insert_zc((ly_ctx *)type_local,(char *)value_len_local,
                                      &storage->_canonical);
                ret = ret & ~LY_EMEM;
              }
            }
          }
          else {
            canon = (char *)ly_err_last((ly_ctx *)type_local);
            type_str._4_4_ =
                 ly_err_new(err,type_str._4_4_,LYVE_DATA,((ly_err_item *)canon)->data_path,
                            (char *)0x0,"%s",((ly_err_item *)canon)->msg);
            ly_err_clean((ly_ctx *)type_local,(ly_err_item *)0x0);
          }
        }
        else {
          type_str._4_4_ =
               ly_err_new(err,LY_EVALID,LYVE_DATA,(char *)0x0,(char *)0x0,
                          "Invalid first character \'%c\', list key predicates expected.",
                          CONCAT44(uVar1,(int)*(char *)value_len_local));
        }
      }
    }
  }
LAB_00234ece:
  if ((ret & LY_EMEM) != LY_SUCCESS) {
    free((void *)value_len_local);
  }
  if (type_str._4_4_ != LY_SUCCESS) {
    lyplg_type_free_xpath10((ly_ctx *)type_local,storage);
  }
  return type_str._4_4_;
}

Assistant:

static LY_ERR
lyplg_type_store_instanceid_keys(const struct ly_ctx *ctx, const struct lysc_type *type, const void *value, size_t value_len,
        uint32_t options, LY_VALUE_FORMAT format, void *prefix_data, uint32_t hints, const struct lysc_node *UNUSED(ctx_node),
        struct lyd_value *storage, struct lys_glob_unres *UNUSED(unres), struct ly_err_item **err)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysc_type_str *type_str = (struct lysc_type_str *)type;
    struct lyd_value_instance_identifier_keys *val;
    uint32_t *prev_lo, temp_lo = LY_LOSTORE;
    const struct ly_err_item *eitem;
    char *canon;

    /* init storage */
    memset(storage, 0, sizeof *storage);
    LYPLG_TYPE_VAL_INLINE_PREPARE(storage, val);
    LY_CHECK_ERR_GOTO(!val, ret = LY_EMEM, cleanup);
    storage->realtype = type;

    /* check hints */
    ret = lyplg_type_check_hints(hints, value, value_len, type->basetype, NULL, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* length restriction of the string */
    if (type_str->length) {
        /* value_len is in bytes, but we need number of characters here */
        ret = lyplg_type_validate_range(LY_TYPE_STRING, type_str->length, ly_utf8len(value, value_len), value, value_len, err);
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* pattern restrictions */
    ret = lyplg_type_validate_patterns(type_str->patterns, value, value_len, err);
    LY_CHECK_GOTO(ret, cleanup);

    /* parse instance-identifier keys, with optional prefix even though it should be mandatory */
    if (value_len && (((char *)value)[0] != '[')) {
        ret = ly_err_new(err, LY_EVALID, LYVE_DATA, NULL, NULL, "Invalid first character '%c', list key predicates expected.",
                ((char *)value)[0]);
        goto cleanup;
    }

    /* do not log */
    prev_lo = ly_temp_log_options(&temp_lo);
    ret = ly_path_parse_predicate(ctx, NULL, value_len ? value : "", value_len, LY_PATH_PREFIX_OPTIONAL,
            LY_PATH_PRED_KEYS, &val->keys);
    ly_temp_log_options(prev_lo);
    if (ret) {
        eitem = ly_err_last(ctx);
        ret = ly_err_new(err, ret, LYVE_DATA, eitem->data_path, NULL, "%s", eitem->msg);
        ly_err_clean((struct ly_ctx *)ctx, NULL);
        goto cleanup;
    }
    val->ctx = ctx;

    /* store format-specific data and context for later prefix resolution */
    ret = lyplg_type_prefix_data_new(ctx, value, value_len, format, prefix_data, &val->format, &val->prefix_data);
    LY_CHECK_GOTO(ret, cleanup);

    switch (format) {
    case LY_VALUE_CANON:
    case LY_VALUE_JSON:
    case LY_VALUE_LYB:
    case LY_VALUE_STR_NS:
        /* store canonical value */
        if (options & LYPLG_TYPE_STORE_DYNAMIC) {
            ret = lydict_insert_zc(ctx, (char *)value, &storage->_canonical);
            options &= ~LYPLG_TYPE_STORE_DYNAMIC;
            LY_CHECK_GOTO(ret, cleanup);
        } else {
            ret = lydict_insert(ctx, value_len ? value : "", value_len, &storage->_canonical);
            LY_CHECK_GOTO(ret, cleanup);
        }
        break;
    case LY_VALUE_SCHEMA:
    case LY_VALUE_SCHEMA_RESOLVED:
    case LY_VALUE_XML:
        /* JSON format with prefix is the canonical one */
        ret = instanceid_keys_print_value(val, LY_VALUE_JSON, NULL, &canon, err);
        LY_CHECK_GOTO(ret, cleanup);

        ret = lydict_insert_zc(ctx, canon, &storage->_canonical);
        LY_CHECK_GOTO(ret, cleanup);
        break;
    }

cleanup:
    if (options & LYPLG_TYPE_STORE_DYNAMIC) {
        free((void *)value);
    }

    if (ret) {
        lyplg_type_free_xpath10(ctx, storage);
    }
    return ret;
}